

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_file_function.hpp
# Opt level: O1

OperatorPartitionData *
duckdb::MultiFileFunction<duckdb::ParquetMultiFileInfo>::MultiFileGetPartitionData
          (OperatorPartitionData *__return_storage_ptr__,ClientContext *context,
          TableFunctionGetPartitionInput *input)

{
  FunctionData *pFVar1;
  GlobalTableFunctionState *pGVar2;
  pointer pMVar3;
  LocalTableFunctionState *pLVar4;
  vector<duckdb::ColumnPartitionData,_true> *pvVar5;
  
  optional_ptr<const_duckdb::FunctionData,_true>::CheckValid(&input->bind_data);
  pFVar1 = (input->bind_data).ptr;
  optional_ptr<duckdb::LocalTableFunctionState,_true>::CheckValid(&input->local_state);
  pLVar4 = (input->local_state).ptr;
  optional_ptr<duckdb::GlobalTableFunctionState,_true>::CheckValid(&input->global_state);
  pGVar2 = (input->global_state).ptr;
  __return_storage_ptr__->batch_index = (idx_t)pLVar4[5]._vptr_LocalTableFunctionState;
  pvVar5 = &__return_storage_ptr__->partition_data;
  (__return_storage_ptr__->partition_data).
  super_vector<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>.
  super__Vector_base<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->partition_data).
  super_vector<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>.
  super__Vector_base<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->partition_data).
  super_vector<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>.
  super__Vector_base<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pMVar3 = unique_ptr<duckdb::MultiFileReader,_std::default_delete<duckdb::MultiFileReader>,_true>::
           operator->((unique_ptr<duckdb::MultiFileReader,_std::default_delete<duckdb::MultiFileReader>,_true>
                       *)(pFVar1 + 7));
  pLVar4 = pLVar4 + 3;
  optional_ptr<duckdb::MultiFileReaderData,_true>::CheckValid
            ((optional_ptr<duckdb::MultiFileReaderData,_true> *)pLVar4);
  (*pMVar3->_vptr_MultiFileReader[0xd])
            (pMVar3,context,pFVar1 + 0xb,pLVar4->_vptr_LocalTableFunctionState,
             pGVar2[4]._vptr_GlobalTableFunctionState,input->partition_info,__return_storage_ptr__,
             pvVar5);
  return __return_storage_ptr__;
}

Assistant:

static OperatorPartitionData MultiFileGetPartitionData(ClientContext &context,
	                                                       TableFunctionGetPartitionInput &input) {
		auto &bind_data = input.bind_data->CastNoConst<MultiFileBindData>();
		auto &data = input.local_state->Cast<MultiFileLocalState>();
		auto &gstate = input.global_state->Cast<MultiFileGlobalState>();
		OperatorPartitionData partition_data(data.batch_index);
		bind_data.multi_file_reader->GetPartitionData(context, bind_data.reader_bind, *data.reader_data,
		                                              gstate.multi_file_reader_state, input.partition_info,
		                                              partition_data);
		return partition_data;
	}